

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O1

void __thiscall
libguarded::
rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
::rcu_guard::unlock(rcu_guard *this)

{
  node *pnVar1;
  _Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  _Var2;
  _Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false> _Var3;
  __pointer_type pzVar4;
  __pointer_type pzVar5;
  
  pzVar5 = (this->m_zombie->next)._M_b._M_p;
  pzVar4 = pzVar5;
  if (pzVar5 != (__pointer_type)0x0) {
    do {
      if ((pzVar4->owner)._M_b._M_p != (__pointer_type)0x0) goto LAB_00104e17;
      pzVar4 = (pzVar4->next)._M_b._M_p;
    } while (pzVar4 != (__pointer_type)0x0);
    do {
      pnVar1 = pzVar5->zombie_node;
      if (pnVar1 != (node *)0x0) {
        _Var2.super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
             (pnVar1->data).slotMethod._M_t.
             super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
             .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>;
        if (_Var2.super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>.
            _M_head_impl != (BentoAbstract *)0x0) {
          (**(code **)(*(long *)_Var2.
                                super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>
                                ._M_head_impl + 8))();
        }
        (pnVar1->data).slotMethod._M_t.
        super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
        .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false> =
             (_Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>)0x0;
        _Var3._M_head_impl =
             *(BentoAbstract **)
              &(pnVar1->data).signalMethod._M_t.
               super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
        ;
        if ((_Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>)_Var3._M_head_impl !=
            (_Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>)0x0) {
          (**(code **)(*(long *)_Var3._M_head_impl + 8))();
        }
        (pnVar1->data).signalMethod._M_t.
        super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
             = (_Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
                )0x0;
        operator_delete(pnVar1,0x38);
      }
      pzVar4 = (pzVar5->next)._M_b._M_p;
      operator_delete(pzVar5,0x18);
      pzVar5 = pzVar4;
    } while (pzVar4 != (__pointer_type)0x0);
  }
  LOCK();
  (this->m_zombie->next)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
LAB_00104e17:
  LOCK();
  (this->m_zombie->owner)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::rcu_guard::unlock()
{
   zombie_list_node *cached_next = m_zombie->next.load();
   zombie_list_node *n           = cached_next;

   bool last = true;

   while (n) {
      if (n->owner.load() != nullptr) {
         last = false;
         break;
      }

      n = n->next.load();
   }

   n = cached_next;

   if (last) {
      while (n) {
         node *deadNode = n->zombie_node;

         if (deadNode != nullptr) {
            node_alloc_trait::destroy(m_list->m_node_alloc, deadNode);
            node_alloc_trait::deallocate(m_list->m_node_alloc, deadNode, 1);
         }

         zombie_list_node *oldnode = n;
         n = n->next.load();

         if (oldnode != nullptr) {
            zombie_alloc_trait::destroy(m_list->m_zombie_alloc, oldnode);
            zombie_alloc_trait::deallocate(m_list->m_zombie_alloc, oldnode, 1);
         }
      }

      m_zombie->next.store(n);
   }

   m_zombie->owner.store(nullptr);
}